

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix.h
# Opt level: O0

void chrono::StreamOUTdenseMatlabFormat(ChMatrixConstRef A,ChStreamOutAscii *stream)

{
  Index IVar1;
  CoeffReturnType CVar2;
  int local_20;
  int local_1c;
  int jj;
  int ii;
  ChStreamOutAscii *stream_local;
  ChMatrixConstRef A_local;
  
  local_1c = 0;
  while( true ) {
    IVar1 = Eigen::
            MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)A);
    if (IVar1 <= local_1c) break;
    local_20 = 0;
    while( true ) {
      IVar1 = Eigen::
              MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
              ::cols((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      *)A);
      if (IVar1 <= local_20) break;
      CVar2 = Eigen::
              DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                            *)A,(long)local_1c,(long)local_20);
      chrono::ChStreamOutAscii::operator<<(stream,CVar2);
      IVar1 = Eigen::
              MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
              ::cols((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      *)A);
      if ((long)local_20 < IVar1 + -1) {
        chrono::ChStreamOutAscii::operator<<(stream," ");
      }
      local_20 = local_20 + 1;
    }
    chrono::ChStreamOutAscii::operator<<(stream,"\n");
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

inline void StreamOUTdenseMatlabFormat(ChMatrixConstRef A, ChStreamOutAscii& stream) {
    for (int ii = 0; ii < A.rows(); ii++) {
        for (int jj = 0; jj < A.cols(); jj++) {
            stream << A(ii, jj);
            if (jj < A.cols() - 1)
                stream << " ";
        }
        stream << "\n";
    }
}